

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

void evutil_freeaddrinfo(addrinfo *ai)

{
  addrinfo *paVar1;
  
  if (-1 < ai->ai_flags) {
    freeaddrinfo((addrinfo *)ai);
    return;
  }
  while (ai != (addrinfo *)0x0) {
    paVar1 = ai->ai_next;
    if (ai->ai_canonname != (char *)0x0) {
      event_mm_free_(ai->ai_canonname);
    }
    event_mm_free_(ai);
    ai = paVar1;
  }
  return;
}

Assistant:

void
evutil_freeaddrinfo(struct evutil_addrinfo *ai)
{
#ifdef EVENT__HAVE_GETADDRINFO
	if (!(ai->ai_flags & EVUTIL_AI_LIBEVENT_ALLOCATED)) {
		freeaddrinfo(ai);
		return;
	}
#endif
	while (ai) {
		struct evutil_addrinfo *next = ai->ai_next;
		if (ai->ai_canonname)
			mm_free(ai->ai_canonname);
		mm_free(ai);
		ai = next;
	}
}